

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O2

uint8_t arc4_getbyte(void)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  
  rs.i = rs.i + 1;
  uVar1 = rs.s[rs.i];
  bVar3 = rs.j + uVar1;
  uVar2 = rs.s[bVar3];
  rs.j = bVar3;
  rs.s[rs.i] = uVar2;
  rs.s[bVar3] = uVar1;
  return rs.s[(byte)(uVar2 + uVar1)];
}

Assistant:

static inline uint8_t
arc4_getbyte(void)
{
	uint8_t si, sj;

	rs.i = (rs.i + 1);
	si = rs.s[rs.i];
	rs.j = (rs.j + si);
	sj = rs.s[rs.j];
	rs.s[rs.i] = sj;
	rs.s[rs.j] = si;
	return (rs.s[(si + sj) & 0xff]);
}